

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

SourceCodeInfo_Location * __thiscall
google::protobuf::Arena::DoCreateMessage<google::protobuf::SourceCodeInfo_Location>(Arena *this)

{
  SourceCodeInfo_Location *this_00;
  
  this_00 = (SourceCodeInfo_Location *)
            AllocateAlignedWithHook(this,0x70,(type_info *)&SourceCodeInfo_Location::typeinfo);
  SourceCodeInfo_Location::SourceCodeInfo_Location(this_00,this,false);
  return this_00;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* DoCreateMessage(Args&&... args) {
    return InternalHelper<T>::Construct(
        AllocateInternal(sizeof(T), alignof(T),
                         internal::ObjectDestructor<
                             InternalHelper<T>::is_destructor_skippable::value,
                             T>::destructor,
                         RTTI_TYPE_ID(T)),
        this, std::forward<Args>(args)...);
  }